

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  bool bVar4;
  Struct *pSVar5;
  Struct *pSVar6;
  long lVar7;
  ulong uVar8;
  Signature SVar9;
  Signature SVar10;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar3 = HeapType::isStruct(&local_40);
  if ((bVar3) && (bVar3 = HeapType::isStruct(&a_local), bVar3)) {
    pSVar5 = HeapType::getStruct(&local_40);
    pSVar6 = HeapType::getStruct(&a_local);
    if ((long)(pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start ==
        (long)(pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start) {
      uVar8 = 0xffffffffffffffff;
      lVar7 = 8;
      while( true ) {
        pFVar1 = (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = uVar8 + 1;
        bVar3 = (ulong)((long)(pSVar5->fields).
                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) <= uVar8;
        if (bVar3) {
          return bVar3;
        }
        pFVar2 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&(pFVar1->type).id + lVar7) !=
            *(long *)((long)&(pFVar2->type).id + lVar7)) break;
        bVar4 = shapeEq((Type)*(uintptr_t *)((long)pFVar1 + lVar7 + -8),
                        (Type)*(uintptr_t *)((long)pFVar2 + lVar7 + -8));
        lVar7 = lVar7 + 0x10;
        if (!bVar4) {
          return bVar3;
        }
      }
      return bVar3;
    }
  }
  else {
    bVar3 = HeapType::isArray(&local_40);
    if ((bVar3) && (bVar3 = HeapType::isArray(&a_local), bVar3)) {
      HeapType::getArray(&local_60);
      HeapType::getArray(&local_50);
      if (local_58 == local_48) {
LAB_0097becb:
        bVar3 = shapeEq((Type)local_60.id,(Type)local_50.id);
        return bVar3;
      }
    }
    else {
      bVar3 = HeapType::isSignature(&local_40);
      if ((bVar3) && (bVar3 = HeapType::isSignature(&a_local), bVar3)) {
        SVar9 = HeapType::getSignature(&local_40);
        SVar10 = HeapType::getSignature(&a_local);
        bVar3 = shapeEq(SVar9.params.id,SVar10.params.id);
        local_50.id = SVar10.results.id.id;
        local_60.id = SVar9.results.id.id;
        if (bVar3) goto LAB_0097becb;
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isStruct() && b.isStruct()) {
    return shapeEq(a.getStruct(), b.getStruct());
  }
  if (a.isArray() && b.isArray()) {
    return shapeEq(a.getArray(), b.getArray());
  }
  if (a.isSignature() && b.isSignature()) {
    return shapeEq(a.getSignature(), b.getSignature());
  }
  return false;
}